

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<long,duckdb::TemplatedParquetValueConversion<int>,false,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  int iVar1;
  data_ptr_t pdVar2;
  uint64_t uVar3;
  
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (result_offset < result_offset + num_values) {
    uVar3 = 0;
    do {
      ByteBuffer::available(plain_data,4);
      iVar1 = *(int *)plain_data->ptr;
      plain_data->len = plain_data->len - 4;
      plain_data->ptr = (data_ptr_t)((long)plain_data->ptr + 4);
      *(long *)(pdVar2 + uVar3 * 8 + result_offset * 8) = (long)iVar1;
      uVar3 = uVar3 + 1;
    } while (num_values != uVar3);
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}